

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

void Mips_init(MCRegisterInfo *MRI)

{
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffec;
  uint16_t *in_stack_fffffffffffffff8;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,MipsRegDesc,0x18a,0,0,MipsMCRegisterClasses,0x66f6d0,(uint16_t (*) [2])0x0,0x66f8d0
             ,(MCPhysReg *)CONCAT44(in_stack_ffffffffffffffec,0xc),(char *)0x0,
             in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void Mips_init(MCRegisterInfo *MRI)
{
	// InitMCRegisterInfo(MipsRegDesc, 394, RA, PC,
	// 		MipsMCRegisterClasses, 62,
	// 		MipsRegUnitRoots,
	// 		273,
	// 		MipsRegDiffLists,
	// 		MipsLaneMaskLists,
	// 		MipsRegStrings,
	// 		MipsRegClassStrings,
	// 		MipsSubRegIdxLists,
	// 		12,
	// 		MipsSubRegIdxRanges,
	// 		MipsRegEncodingTable);


	MCRegisterInfo_InitMCRegisterInfo(MRI, MipsRegDesc, 394,
			0, 0,
			MipsMCRegisterClasses, 62,
			0, 0,
			MipsRegDiffLists,
			0,
			MipsSubRegIdxLists, 12,
			0);
}